

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

bool __thiscall
arangodb::velocypack::Builder::checkAttributeUniquenessUnsorted(Builder *this,Slice obj)

{
  __uniq_ptr_impl<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *this_00;
  size_t __n;
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var1;
  undefined1 auVar2 [16];
  ValueLength VVar3;
  size_t __p;
  int iVar4;
  char **ppcVar5;
  ulong uVar6;
  long *in_FS_OFFSET;
  byte bVar7;
  bool bVar8;
  string_view sVar9;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar10;
  Slice key;
  ObjectIterator it;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_4UL> keys;
  uint8_t *local_a8;
  char *local_a0;
  ObjectIterator local_98;
  string_view local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ObjectIterator::ObjectIterator(&local_98,obj,true);
  if (local_98._size < 5) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = (string_view)ZEXT816(0);
    do {
      local_a8 = (uint8_t *)ObjectIterator::key(&local_98,true);
      sVar9 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_a8);
      VVar3 = local_98._position;
      local_a0 = sVar9._M_str;
      bVar7 = local_98._position == 0;
      if (!(bool)bVar7) {
        ppcVar5 = &local_78._M_str;
        uVar6 = 1;
        do {
          __n = ((string_view *)(ppcVar5 + -1))->_M_len;
          if ((__n == sVar9._M_len) &&
             ((__n == 0 || (iVar4 = bcmp(*ppcVar5,local_a0,__n), iVar4 == 0)))) goto LAB_0010761c;
          bVar7 = VVar3 <= uVar6;
          ppcVar5 = ppcVar5 + 2;
          bVar8 = uVar6 != VVar3;
          uVar6 = uVar6 + 1;
        } while (bVar8);
      }
      (&local_78)[VVar3]._M_len = sVar9._M_len;
      (&local_78)[VVar3]._M_str = local_a0;
      ObjectIterator::next(&local_98);
    } while (local_98._position != local_98._size);
  }
  else {
    __tls_init();
    this_00 = (__uniq_ptr_impl<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
               *)(*in_FS_OFFSET + -0x10);
    __tls_init();
    if ((this_00->_M_t).
        super__Tuple_impl<0UL,_std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
        .
        super__Head_base<0UL,_std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_false>
        ._M_head_impl ==
        (unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         *)0x0) {
      local_78._M_len = (size_t)operator_new(0x38);
      (((pointer)local_78._M_len)->_M_h)._M_buckets = (__buckets_ptr)0x0;
      (((pointer)local_78._M_len)->_M_h)._M_bucket_count = 0;
      *(undefined8 *)&(((pointer)local_78._M_len)->_M_h)._M_rehash_policy = 0;
      (((pointer)local_78._M_len)->_M_h)._M_rehash_policy._M_next_resize = 0;
      (((pointer)local_78._M_len)->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      (((pointer)local_78._M_len)->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (((pointer)local_78._M_len)->_M_h)._M_element_count = 0;
      (((pointer)local_78._M_len)->_M_h)._M_buckets =
           &(((pointer)local_78._M_len)->_M_h)._M_single_bucket;
      (((pointer)local_78._M_len)->_M_h)._M_bucket_count = 1;
      (((pointer)local_78._M_len)->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
      (((pointer)local_78._M_len)->_M_h)._M_rehash_policy._M_next_resize = 0;
      (((pointer)local_78._M_len)->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      __tls_init();
      __p = local_78._M_len;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_78._M_str;
      local_78 = (string_view)(auVar2 << 0x40);
      std::
      __uniq_ptr_impl<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
      ::reset(this_00,(pointer)__p);
      std::
      unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                     *)&local_78);
    }
    else {
      __tls_init();
      std::
      _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&((this_00->_M_t).
                super__Tuple_impl<0UL,_std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                .
                super__Head_base<0UL,_std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_false>
               ._M_head_impl)->_M_h);
    }
    do {
      local_a8 = (uint8_t *)ObjectIterator::key(&local_98,true);
      p_Var1 = (_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)(this_00->_M_t).
                  super__Tuple_impl<0UL,_std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_std::default_delete<std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                  .
                  super__Head_base<0UL,_std::unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_false>
                  ._M_head_impl;
      local_78 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                           ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                            &local_a8);
      pVar10 = std::
               _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>>(p_Var1,&local_78);
      bVar7 = pVar10.second;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
      ObjectIterator::next(&local_98);
    } while (local_98._position != local_98._size);
  }
LAB_0010761c:
  return (bool)(bVar7 & 1);
}

Assistant:

bool Builder::checkAttributeUniquenessUnsorted(Slice obj) const {
  // cutoff value for linear attribute uniqueness scan
  // unsorted objects with this amount of attributes (or less) will
  // be validated using a non-allocating scan over the attributes
  // objects with more attributes will use a validation routine that
  // will use an std::unordered_set for O(1) lookups but with heap
  // allocations
  ObjectIterator it(obj, true);

  if (it.size() <= ::linearAttributeUniquenessCutoff) {
    return ::checkAttributeUniquenessUnsortedBrute(it);
  }
  return ::checkAttributeUniquenessUnsortedSet(it);
}